

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::peer_disconnected_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_disconnected_alert *this)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  error_category *peVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  allocator<char> local_2e5 [13];
  string local_2d8;
  string local_2b8;
  string local_298;
  char local_278 [8];
  char buf [600];
  peer_disconnected_alert *this_local;
  
  peer_alert::message_abi_cxx11_(&local_298,&this->super_peer_alert);
  uVar3 = std::__cxx11::string::c_str();
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::socket_type_str +
           (long)*(int *)&(this->super_peer_alert).field_0x9c * 8);
  pcVar4 = operation_name(this->op);
  peVar5 = boost::system::error_code::category(&this->error);
  iVar2 = (**peVar5->_vptr_error_category)();
  boost::system::error_code::message_abi_cxx11_(&local_2d8,&this->error);
  convert_from_native(&local_2b8,&local_2d8);
  uVar6 = std::__cxx11::string::c_str();
  snprintf(local_278,600,"%s disconnecting (%s) [%s] [%s]: %s (reason: %d)",uVar3,uVar1,pcVar4,
           CONCAT44(extraout_var,iVar2),uVar6,(uint)this->reason);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,local_2e5);
  std::allocator<char>::~allocator(local_2e5);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_disconnected_alert::message() const
	{
		char buf[600];
		std::snprintf(buf, sizeof(buf), "%s disconnecting (%s) [%s] [%s]: %s (reason: %d)"
			, peer_alert::message().c_str()
			, socket_type_str[socket_type]
			, operation_name(op), error.category().name()
			, convert_from_native(error.message()).c_str()
			, int(reason));
		return buf;
	}